

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall
print_info::perform(print_info *this,filesystemcollection *fslist,readercollection *rdlist)

{
  allocator<char> local_39;
  string local_38;
  
  printf("readers: ( total = %d )\n",
         (ulong)(uint)(rdlist->_rdbyname)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  readercollection::printreadertree(rdlist,&local_38,0);
  std::__cxx11::string::~string((string *)&local_38);
  printf("filesystems: ( total = %d )\n",
         (ulong)(uint)(fslist->_byname)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  filesystemcollection::
  enumerate_filesystems<print_info::perform(filesystemcollection&,readercollection&)::_lambda(std::__cxx11::string_const&,std::shared_ptr<FileContainer>)_1_>
            (fslist);
  return;
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        printf("readers: ( total = %d )\n", (int)rdlist.count());
        rdlist.printreadertree("", 0);
        printf("filesystems: ( total = %d )\n", (int)fslist.count());
        fslist.enumerate_filesystems([](const std::string& name, FileContainer_ptr fs) {
            printf("    %-10s  %s\n", name.c_str(), fs->infostring().c_str());
        });
    }